

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O0

void P_Start3dMidtexInterpolations
               (TArray<DInterpolation_*,_DInterpolation_*> *list,sector_t_conflict *sector,
               bool ceiling)

{
  uint uVar1;
  sector_t_conflict *psVar2;
  uint uVar3;
  line_t_conflict **pplVar4;
  midtex *local_50;
  DInterpolation *local_48;
  DInterpolation *local_40;
  line_t_conflict *local_38;
  line_t_conflict *l;
  midtex *pmStack_28;
  uint i;
  plane *scrollplane;
  sector_t_conflict *psStack_18;
  bool ceiling_local;
  sector_t_conflict *sector_local;
  TArray<DInterpolation_*,_DInterpolation_*> *list_local;
  
  if (ceiling) {
    local_50 = (midtex *)&(sector->e->Midtex).Ceiling;
  }
  else {
    local_50 = &sector->e->Midtex;
  }
  pmStack_28 = local_50;
  l._4_4_ = 0;
  scrollplane._7_1_ = ceiling;
  psStack_18 = sector;
  sector_local = (sector_t_conflict *)list;
  while( true ) {
    uVar1 = l._4_4_;
    uVar3 = TArray<line_t_*,_line_t_*>::Size(&(pmStack_28->Floor).AttachedLines);
    if (uVar3 <= uVar1) break;
    pplVar4 = TArray<line_t_*,_line_t_*>::operator[]
                        (&(pmStack_28->Floor).AttachedLines,(ulong)l._4_4_);
    psVar2 = sector_local;
    local_38 = *pplVar4;
    local_40 = side_t::SetInterpolation(local_38->sidedef[0],1);
    TArray<DInterpolation_*,_DInterpolation_*>::Push
              ((TArray<DInterpolation_*,_DInterpolation_*> *)psVar2,&local_40);
    psVar2 = sector_local;
    local_48 = side_t::SetInterpolation(local_38->sidedef[1],1);
    TArray<DInterpolation_*,_DInterpolation_*>::Push
              ((TArray<DInterpolation_*,_DInterpolation_*> *)psVar2,&local_48);
    l._4_4_ = l._4_4_ + 1;
  }
  return;
}

Assistant:

void P_Start3dMidtexInterpolations(TArray<DInterpolation *> &list, sector_t *sector, bool ceiling)
{
	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	for(unsigned i = 0; i < scrollplane.AttachedLines.Size(); i++)
	{
		line_t *l = scrollplane.AttachedLines[i];

		list.Push(l->sidedef[0]->SetInterpolation(side_t::mid));
		list.Push(l->sidedef[1]->SetInterpolation(side_t::mid));
	}
}